

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/external/Catch2/single_include/catch2/catch.hpp:9773:41)>
::setValue(BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_rabauke[P]trng4_external_Catch2_single_include_catch2_catch_hpp:9773:41)>
           *this,string *arg)

{
  ParserResult *in_RDI;
  string *in_stack_00000050;
  anon_class_8_1_50637480_for_m_lambda *in_stack_00000058;
  
  invokeLambda<std::__cxx11::string,Catch::makeCommandLineParser(Catch::ConfigData&)::__10>
            (in_stack_00000058,in_stack_00000050);
  return in_RDI;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }